

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O3

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  void *pvVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  int iVar23;
  int kj;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  float fVar27;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_148;
  allocator_type local_111;
  ulong local_110;
  long local_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  void *local_d8;
  ulong local_d0;
  Mat local_c8;
  void *local_88;
  long local_80;
  void *local_78;
  long local_70;
  long local_68;
  long local_60;
  ulong local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar13 = bottom_blob->c;
  uVar24 = (ulong)uVar13;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.c = 0;
    local_c8.cstep = 0;
    local_f8 = uVar24;
    make_padding(this,bottom_blob,&local_c8,opt);
    iVar9 = -100;
    if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
      iVar3 = local_c8.w;
      iVar4 = local_c8.h;
      uVar24 = (long)(local_c8.w - this->kernel_w) / (long)this->stride_w;
      local_d0 = uVar24 & 0xffffffff;
      uVar20 = (long)(local_c8.h - this->kernel_h) / (long)this->stride_h;
      local_e8 = uVar20 & 0xffffffff;
      uVar26 = (int)uVar24 + 1;
      uVar13 = (int)uVar20 + 1;
      iVar25 = (int)local_f8;
      Mat::create(top_blob,uVar26,uVar13,iVar25,sVar5,opt->blob_allocator);
      iVar9 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        uVar24 = (long)this->kernel_h * (long)this->kernel_w;
        std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar24,&local_111);
        iVar9 = this->kernel_h;
        if (0 < iVar9) {
          iVar11 = this->kernel_w;
          iVar8 = iVar3 - iVar11;
          iVar10 = 0;
          iVar14 = 0;
          iVar19 = 0;
          do {
            if (0 < iVar11) {
              lVar12 = 0;
              do {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar19 + lVar12] = iVar14 + (int)lVar12;
                iVar11 = this->kernel_w;
                lVar12 = lVar12 + 1;
                iVar23 = (int)lVar12;
              } while (iVar23 < iVar11);
              iVar19 = iVar19 + iVar23;
              iVar9 = this->kernel_h;
              iVar14 = iVar14 + iVar23;
            }
            iVar14 = iVar14 + iVar8;
            iVar10 = iVar10 + 1;
          } while (iVar10 < iVar9);
        }
        iVar9 = (int)uVar24;
        if (this->pooling_type == 1) {
          if (this->avgpool_count_include_pad == 0) {
            iVar9 = 0;
            iVar11 = 0;
            if (this->pad_mode == 0) {
              iVar9 = (bottom_blob->w - local_c8.w) + this->pad_left + this->pad_right;
              iVar11 = (bottom_blob->h - local_c8.h) + this->pad_top + this->pad_bottom;
            }
            if (0 < iVar25) {
              local_50 = (long)(int)uVar26;
              local_88 = local_c8.data;
              local_78 = top_blob->data;
              local_80 = top_blob->cstep * top_blob->elemsize;
              local_68 = (long)this->stride_h;
              local_58 = (ulong)uVar13;
              local_110 = (ulong)uVar26;
              lVar12 = (long)local_c8.w *
                       CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
              local_70 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) *
                         local_c8.cstep;
              local_60 = lVar12 * local_68;
              local_f0 = 0;
              do {
                if (-1 < (int)local_e8) {
                  local_148 = (void *)(local_80 * local_f0 + (long)local_78);
                  local_100 = (void *)(long)this->stride_w;
                  uVar13 = this->kernel_h;
                  local_108 = (long)local_100 * 4;
                  local_d8 = local_88;
                  local_e0 = 0;
                  do {
                    if (-1 < (int)local_d0) {
                      iVar25 = this->pad_top;
                      lVar16 = 0;
                      uVar24 = 0;
                      pvVar18 = local_d8;
                      do {
                        fVar27 = NAN;
                        if (0 < (int)uVar13) {
                          fVar27 = 0.0;
                          uVar20 = 0;
                          iVar8 = 0;
                          pvVar15 = pvVar18;
                          do {
                            lVar1 = uVar20 + local_e0 * local_68;
                            if (iVar25 <= lVar1) {
                              if ((iVar11 + iVar4) - this->pad_bottom <= lVar1) break;
                              if (0 < this->kernel_w) {
                                uVar21 = 0;
                                do {
                                  if ((long)this->pad_left <= (long)(lVar16 + uVar21)) {
                                    if ((long)((iVar9 + iVar3) - this->pad_right) <=
                                        (long)(lVar16 + uVar21)) break;
                                    fVar27 = fVar27 + *(float *)((long)pvVar15 + uVar21 * 4);
                                    iVar8 = iVar8 + 1;
                                  }
                                  uVar21 = uVar21 + 1;
                                } while ((uint)this->kernel_w != uVar21);
                              }
                            }
                            uVar20 = uVar20 + 1;
                            pvVar15 = (void *)((long)pvVar15 + lVar12);
                          } while (uVar20 != uVar13);
                          fVar27 = fVar27 / (float)iVar8;
                        }
                        *(float *)((long)local_148 + uVar24 * 4) = fVar27;
                        uVar24 = uVar24 + 1;
                        pvVar18 = (void *)((long)pvVar18 + local_108);
                        lVar16 = lVar16 + (long)local_100;
                      } while (uVar24 != local_110);
                    }
                    local_148 = (void *)((long)local_148 + local_50 * 4);
                    local_e0 = local_e0 + 1;
                    local_d8 = (void *)((long)local_d8 + local_60);
                  } while (local_e0 != local_58);
                }
                local_f0 = local_f0 + 1;
                local_88 = (void *)((long)local_88 + local_70);
              } while (local_f0 != local_f8);
            }
          }
          else if (0 < iVar25) {
            local_100 = local_c8.data;
            local_108 = local_c8.cstep *
                        CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
            local_110 = CONCAT44(local_110._4_4_,local_c8.w);
            pvVar18 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            local_148 = (void *)0x0;
            do {
              if (-1 < (int)local_e8) {
                pvVar15 = (void *)(sVar5 * sVar6 * (long)local_148 + (long)pvVar18);
                iVar3 = this->stride_h;
                iVar4 = this->stride_w;
                uVar20 = 0;
                do {
                  if (-1 < (int)local_d0) {
                    uVar21 = 0;
                    do {
                      if (iVar9 < 1) {
                        fVar27 = 0.0;
                      }
                      else {
                        fVar27 = 0.0;
                        uVar17 = 0;
                        do {
                          fVar27 = fVar27 + *(float *)((long)local_c8.data +
                                                      (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar17] *
                                                  4 + uVar21 * (long)iVar4 * 4 +
                                                      (long)(iVar3 * local_c8.w * (int)uVar20) *
                                                      CONCAT44(local_c8.elemsize._4_4_,
                                                               (undefined4)local_c8.elemsize) +
                                                      local_108 * (long)local_148);
                          uVar17 = uVar17 + 1;
                        } while ((uVar24 & 0xffffffff) != uVar17);
                      }
                      *(float *)((long)pvVar15 + uVar21 * 4) = fVar27 * (1.0 / (float)iVar9);
                      uVar21 = uVar21 + 1;
                    } while (uVar21 != uVar26);
                  }
                  pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar26 * 4);
                  uVar20 = uVar20 + 1;
                } while (uVar20 != uVar13);
              }
              local_148 = (void *)((long)local_148 + 1);
            } while (local_148 != (void *)local_f8);
          }
        }
        else if ((this->pooling_type == 0) && (0 < iVar25)) {
          local_100 = local_c8.data;
          local_108 = local_c8.cstep *
                      CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
          local_110 = CONCAT44(local_110._4_4_,local_c8.w);
          pvVar18 = top_blob->data;
          sVar5 = top_blob->cstep;
          sVar6 = top_blob->elemsize;
          local_148 = (void *)0x0;
          do {
            if (-1 < (int)local_e8) {
              pvVar15 = (void *)(sVar5 * sVar6 * (long)local_148 + (long)pvVar18);
              iVar3 = this->stride_h;
              iVar4 = this->stride_w;
              uVar20 = 0;
              do {
                if (-1 < (int)local_d0) {
                  lVar12 = (long)(iVar3 * local_c8.w * (int)uVar20) *
                           CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize) +
                           local_108 * (long)local_148;
                  uVar21 = 0;
                  do {
                    lVar16 = uVar21 * (long)iVar4;
                    fVar27 = *(float *)((long)local_c8.data + lVar16 * 4 + lVar12);
                    if (0 < iVar9) {
                      uVar17 = 0;
                      do {
                        fVar2 = *(float *)((long)local_c8.data +
                                          (long)local_48.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start[uVar17] * 4
                                          + lVar16 * 4 + lVar12);
                        if (fVar27 <= fVar2) {
                          fVar27 = fVar2;
                        }
                        uVar17 = uVar17 + 1;
                      } while ((uVar24 & 0xffffffff) != uVar17);
                    }
                    *(float *)((long)pvVar15 + uVar21 * 4) = fVar27;
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != uVar26);
                }
                pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar26 * 4);
                uVar20 = uVar20 + 1;
              } while (uVar20 != uVar13);
            }
            local_148 = (void *)((long)local_148 + 1);
          } while (local_148 != (void *)local_f8);
        }
        if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        iVar9 = 0;
      }
    }
    piVar7 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (**(code **)(*(long *)local_c8.allocator + 0x18))();
        }
      }
    }
  }
  else {
    iVar3 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    Mat::create(top_blob,uVar13,sVar5,opt->blob_allocator);
    pvVar18 = top_blob->data;
    iVar9 = -100;
    if ((pvVar18 != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar26 = iVar4 * iVar3;
      if (this->pooling_type == 0) {
        if ((int)uVar13 < 1) {
          return 0;
        }
        lVar12 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar15 = bottom_blob->data;
        uVar20 = 0;
        pvVar22 = pvVar15;
        do {
          fVar27 = *(float *)((long)pvVar15 + lVar12 * uVar20);
          if (0 < (int)uVar26) {
            uVar21 = 0;
            do {
              fVar2 = *(float *)((long)pvVar22 + uVar21 * 4);
              if (fVar27 <= fVar2) {
                fVar27 = fVar2;
              }
              uVar21 = uVar21 + 1;
            } while (uVar26 != uVar21);
          }
          *(float *)((long)pvVar18 + uVar20 * 4) = fVar27;
          uVar20 = uVar20 + 1;
          pvVar22 = (void *)((long)pvVar22 + lVar12);
        } while (uVar20 != uVar24);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar13 < 1) {
          return 0;
        }
        sVar5 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        pvVar15 = bottom_blob->data;
        uVar20 = 0;
        do {
          fVar27 = 0.0;
          if (0 < (int)uVar26) {
            uVar21 = 0;
            do {
              fVar27 = fVar27 + *(float *)((long)pvVar15 + uVar21 * 4);
              uVar21 = uVar21 + 1;
            } while (uVar26 != uVar21);
          }
          *(float *)((long)pvVar18 + uVar20 * 4) = fVar27 * (1.0 / (float)(int)uVar26);
          uVar20 = uVar20 + 1;
          pvVar15 = (void *)((long)pvVar15 + sVar5 * sVar6);
        } while (uVar20 != uVar24);
      }
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i*stride_h) + j*stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[ space_ofs[k] ];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}